

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

string * google::protobuf::compiler::python::anon_unknown_0::
         NamePrefixedWithNestedTypes<google::protobuf::Descriptor>
                   (string *__return_storage_ptr__,Descriptor *descriptor,string *separator)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  undefined1 *puVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  int iVar5;
  long *plVar6;
  char **ppcVar7;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar8;
  size_type *psVar9;
  long *plVar10;
  string prefix;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  paVar1 = &local_c0.field_2;
  lVar2 = **(long **)(descriptor + 8);
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,lVar2,(*(long **)(descriptor + 8))[1] + lVar2);
  if (*(Descriptor **)(descriptor + 0x18) != (Descriptor *)0x0) {
    NamePrefixedWithNestedTypes<google::protobuf::Descriptor>
              ((string *)local_80,*(Descriptor **)(descriptor + 0x18),separator);
    iVar5 = std::__cxx11::string::compare((char *)separator);
    if ((iVar5 == 0) &&
       (ppcVar7 = std::
                  __find_if<char_const*const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                            ((anonymous_namespace)::kKeywords,&ruby::Generator::vtable,&local_c0),
       ppcVar7 != (char **)&ruby::Generator::vtable)) {
      std::operator+(&local_40,"getattr(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_40);
      plVar10 = plVar6 + 2;
      if ((long *)*plVar6 == plVar10) {
        local_50 = *plVar10;
        lStack_48 = plVar6[3];
        local_60._M_allocated_capacity = (size_type)&local_50;
      }
      else {
        local_50 = *plVar10;
        local_60._M_allocated_capacity = (size_type)(long *)*plVar6;
      }
      local_60._8_8_ = plVar6[1];
      *plVar6 = (long)plVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 (local_60._M_local_buf,(ulong)local_c0._M_dataplus._M_p);
      psVar9 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_a0.field_2._M_allocated_capacity = *psVar9;
        local_a0.field_2._8_8_ = plVar6[3];
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      }
      else {
        local_a0.field_2._M_allocated_capacity = *psVar9;
        local_a0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_a0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_a0);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar9 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar9) {
        lVar2 = plVar6[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      }
      __return_storage_ptr__->_M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if ((long *)local_60._M_allocated_capacity != &local_50) {
        operator_delete((void *)local_60._M_allocated_capacity);
      }
      pbVar4 = &local_40;
    }
    else {
      std::operator+(&local_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     separator);
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_a0,(ulong)local_c0._M_dataplus._M_p);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar9 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar9) {
        lVar2 = plVar6[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      }
      __return_storage_ptr__->_M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      pbVar4 = &local_a0;
    }
    puVar3 = (undefined1 *)(&(pbVar4->field_2)._M_allocated_capacity)[-2];
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar3 != &pbVar4->field_2) {
      operator_delete(puVar3);
    }
    psVar8 = (string *)(local_80 + 0x10);
    if ((string *)local_80._0_8_ != psVar8) {
      operator_delete((void *)local_80._0_8_);
      psVar8 = extraout_RAX;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p);
      psVar8 = extraout_RAX_00;
    }
    return psVar8;
  }
  iVar5 = std::__cxx11::string::compare((char *)separator);
  if (iVar5 == 0) {
    ResolveKeyword((string *)local_80,&local_c0);
    std::__cxx11::string::operator=((string *)&local_c0,(string *)local_80);
    if ((string *)local_80._0_8_ != (string *)(local_80 + 0x10)) {
      operator_delete((void *)local_80._0_8_);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p == paVar1) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_c0.field_2._M_allocated_capacity
    ;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_c0.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_c0._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_c0.field_2._M_allocated_capacity
    ;
  }
  __return_storage_ptr__->_M_string_length = local_c0._M_string_length;
  return (string *)local_c0._M_string_length;
}

Assistant:

std::string NamePrefixedWithNestedTypes(const DescriptorT& descriptor,
                                        const std::string& separator) {
  std::string name = descriptor.name();
  const Descriptor* parent = descriptor.containing_type();
  if (parent != nullptr) {
    std::string prefix = NamePrefixedWithNestedTypes(*parent, separator);
    if (separator == "." && IsPythonKeyword(name)) {
      return "getattr(" + prefix + ", '" + name + "')";
    } else {
      return prefix + separator + name;
    }
  }
  if (separator == ".") {
    name = ResolveKeyword(name);
  }
  return name;
}